

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  uint uVar1;
  char local_a8 [4];
  int index;
  char name [64];
  char var [64];
  char *type;
  int tb_local;
  TextureType ttype_local;
  int stage_local;
  Context *ctx_local;
  
  var._56_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
  if (ttype == TEXTURE_TYPE_2D) {
    var._56_8_ = anon_var_dwarf_35dd;
  }
  else if (ttype == TEXTURE_TYPE_CUBE) {
    var._56_8_ = anon_var_dwarf_35e8;
  }
  else if (ttype == TEXTURE_TYPE_VOLUME) {
    var._56_8_ = anon_var_dwarf_35f3;
  }
  else {
    fail(ctx,"BUG: used a sampler we don\'t know how to define.");
  }
  get_GLSL_varname_in_buf(ctx,REG_TYPE_SAMPLER,stage,name + 0x38,0x40);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"uniform %s %s;",var._56_8_,name + 0x38);
  if (tb != 0) {
    uVar1 = ctx->uniform_float4_count;
    ctx->uniform_float4_count = ctx->uniform_float4_count + 2;
    get_GLSL_uniform_array_varname(ctx,REG_TYPE_CONST,local_a8,0x40);
    output_line(ctx,"#define %s_texbem %s[%d]",name + 0x38,local_a8,(ulong)uVar1);
    output_line(ctx,"#define %s_texbeml %s[%d]",name + 0x38,local_a8,(ulong)(uVar1 + 1));
  }
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    const char *type = "";
    switch (ttype)
    {
        case TEXTURE_TYPE_2D: type = "sampler2D"; break;
        case TEXTURE_TYPE_CUBE: type = "samplerCube"; break;
        case TEXTURE_TYPE_VOLUME: type = "sampler3D"; break;
        default: fail(ctx, "BUG: used a sampler we don't know how to define.");
    } // switch

    char var[64];
    get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof (var));

    push_output(ctx, &ctx->globals);
    output_line(ctx, "uniform %s %s;", type, var);
    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        char name[64];
        const int index = ctx->uniform_float4_count;
        ctx->uniform_float4_count += 2;
        get_GLSL_uniform_array_varname(ctx, REG_TYPE_CONST, name, sizeof (name));
        output_line(ctx, "#define %s_texbem %s[%d]", var, name, index);
        output_line(ctx, "#define %s_texbeml %s[%d]", var, name, index+1);
    } // if
    pop_output(ctx);
}